

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O3

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::AppendDeviceData
          (ArchiverFactoryImpl *this,IDataBlob *pSrcArchive,ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
          IDataBlob *pDeviceArchive,IDataBlob **ppDstArchive)

{
  IDataBlob *pIVar1;
  DeviceType Dev;
  long lVar2;
  string msg;
  DeviceObjectArchive DevObjectArchive;
  undefined1 local_218 [224];
  RefCntAutoPtr<Diligent::IDataBlob> local_138;
  CreateInfo local_128;
  undefined1 local_118 [224];
  RefCntAutoPtr<Diligent::IDataBlob> local_38;
  
  if (pSrcArchive == (IDataBlob *)0x0) {
    FormatString<char[29]>((string *)local_218,(char (*) [29])"pSrcArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_218._0_8_,"AppendDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0x102);
  }
  else if (pDeviceArchive == (IDataBlob *)0x0) {
    FormatString<char[32]>((string *)local_218,(char (*) [32])"pDeviceArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_218._0_8_,"AppendDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0x107);
  }
  else {
    if (ppDstArchive != (IDataBlob **)0x0) {
      if (*ppDstArchive != (IDataBlob *)0x0) {
        FormatString<char[27]>((string *)local_218,(char (*) [27])"*ppDstArchive must be null");
        DebugAssertionFailed
                  ((Char *)local_218._0_8_,"AppendDeviceData",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
                   ,0x10f);
        if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
          operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
        }
      }
      local_118._8_4_ = 0xffffffff;
      local_118[0xc] = false;
      local_118._0_8_ = pSrcArchive;
      DeviceObjectArchive::DeviceObjectArchive
                ((DeviceObjectArchive *)local_218,(CreateInfo *)local_118);
      local_128.ContentVersion = 0xffffffff;
      local_128.MakeCopy = false;
      local_128.pData = pDeviceArchive;
      DeviceObjectArchive::DeviceObjectArchive((DeviceObjectArchive *)local_118,&local_128);
      for (; DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE;
          DeviceFlags = DeviceFlags ^ -DeviceFlags & DeviceFlags) {
        Dev = ArchiveDeviceDataFlagToArchiveDeviceType(-DeviceFlags & DeviceFlags);
        DeviceObjectArchive::AppendDeviceData
                  ((DeviceObjectArchive *)local_218,(DeviceObjectArchive *)local_118,Dev);
      }
      DeviceObjectArchive::Serialize((DeviceObjectArchive *)local_218,ppDstArchive);
      pIVar1 = *ppDstArchive;
      if (local_38.m_pObject != (IDataBlob *)0x0) {
        (*((local_38.m_pObject)->super_IObject)._vptr_IObject[2])();
        local_38.m_pObject = (IDataBlob *)0x0;
      }
      lVar2 = 200;
      do {
        std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::~vector
                  ((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
                   (local_118 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != 0x20);
      std::
      _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_118);
      if (local_138.m_pObject != (IDataBlob *)0x0) {
        (*((local_138.m_pObject)->super_IObject)._vptr_IObject[2])();
        local_138.m_pObject = (IDataBlob *)0x0;
      }
      lVar2 = 200;
      do {
        std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::~vector
                  ((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
                   (local_218 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != 0x20);
      std::
      _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_218);
      return pIVar1 != (IDataBlob *)0x0;
    }
    FormatString<char[30]>((string *)local_218,(char (*) [30])"ppDstArchive must not be null");
    DebugAssertionFailed
              ((Char *)local_218._0_8_,"AppendDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0x10c);
  }
  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  return false;
}

Assistant:

Bool ArchiverFactoryImpl::AppendDeviceData(const IDataBlob*          pSrcArchive,
                                           ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
                                           const IDataBlob*          pDeviceArchive,
                                           IDataBlob**               ppDstArchive) const
{
    if (pSrcArchive == nullptr)
    {
        DEV_ERROR("pSrcArchive must not be null");
        return false;
    }
    if (pDeviceArchive == nullptr)
    {
        DEV_ERROR("pDeviceArchive must not be null");
        return false;
    }
    if (ppDstArchive == nullptr)
    {
        DEV_ERROR("ppDstArchive must not be null");
        return false;
    }
    DEV_CHECK_ERR(*ppDstArchive == nullptr, "*ppDstArchive must be null");

    try
    {
        DeviceObjectArchive       ObjectArchive{DeviceObjectArchive::CreateInfo{pSrcArchive}};
        const DeviceObjectArchive DevObjectArchive{DeviceObjectArchive::CreateInfo{pDeviceArchive}};

        while (DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE)
        {
            const auto DataTypeFlag      = ExtractLSB(DeviceFlags);
            const auto ArchiveDeviceType = ArchiveDeviceDataFlagToArchiveDeviceType(DataTypeFlag);

            ObjectArchive.AppendDeviceData(DevObjectArchive, ArchiveDeviceType);
        }

        ObjectArchive.Serialize(ppDstArchive);
        return *ppDstArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}